

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>::
call_matcher<float,char_const(&)[5]>
          (call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> *this
          ,char *file,unsigned_long line,char *call_string,float *u,char (*u_1) [5])

{
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  local_50;
  location local_48;
  char (*local_38) [5];
  char (*u_local_1) [5];
  float *u_local;
  char *call_string_local;
  unsigned_long line_local;
  char *file_local;
  call_matcher<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
  *this_local;
  
  local_38 = u_1;
  u_local_1 = (char (*) [5])u;
  u_local = (float *)call_string;
  call_string_local = (char *)line;
  line_local = (unsigned_long)file;
  file_local = (char *)this;
  location::location(&local_48,file,line);
  call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::call_matcher_base((call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)this,local_48,(char *)u_local);
  expectation::expectation((expectation *)(this + 0x30));
  *(undefined ***)this = &PTR__call_matcher_007c6d10;
  *(undefined **)(this + 0x30) = &DAT_007c6d78;
  list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
  ::list((list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
          *)(this + 0x38));
  list<trompeloeil::side_effect_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
  ::list((list<trompeloeil::side_effect_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
          *)(this + 0x50));
  std::
  unique_ptr<trompeloeil::return_handler<bool(float,std::__cxx11::string_const&)>,std::default_delete<trompeloeil::return_handler<bool(float,std::__cxx11::string_const&)>>>
  ::
  unique_ptr<std::default_delete<trompeloeil::return_handler<bool(float,std::__cxx11::string_const&)>>,void>
            ((unique_ptr<trompeloeil::return_handler<bool(float,std::__cxx11::string_const&)>,std::default_delete<trompeloeil::return_handler<bool(float,std::__cxx11::string_const&)>>>
              *)(this + 0x68));
  std::make_unique<trompeloeil::sequence_handler<0ul>>();
  std::
  unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
  ::
  unique_ptr<trompeloeil::sequence_handler<0ul>,std::default_delete<trompeloeil::sequence_handler<0ul>>,void>
            ((unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
              *)(this + 0x70),&local_50);
  std::
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  ::~unique_ptr(&local_50);
  std::tuple<float,_const_char_*>::tuple<float,_const_char_(&)[5],_true>
            ((tuple<float,_const_char_*> *)(this + 0x78),(float *)u_local_1,local_38);
  this[0x88] = (call_matcher<bool(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>)
               0x0;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}